

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpath.cpp
# Opt level: O3

float __thiscall VPath::VPathData::length(VPathData *this)

{
  VPointF VVar1;
  VPointF VVar2;
  Element EVar3;
  pointer pEVar4;
  pointer pVVar5;
  ulong uVar6;
  long lVar7;
  pointer pEVar8;
  float fVar9;
  float fVar10;
  float fVar12;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  VBezier VStack_48;
  
  if (this->mLengthDirty == false) {
    fVar9 = this->mLength;
  }
  else {
    this->mLengthDirty = false;
    this->mLength = 0.0;
    pEVar8 = (this->m_elements).super__Vector_base<VPath::Element,_std::allocator<VPath::Element>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pEVar4 = (this->m_elements).super__Vector_base<VPath::Element,_std::allocator<VPath::Element>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    fVar9 = 0.0;
    if (pEVar8 != pEVar4) {
      lVar7 = 0;
      do {
        EVar3 = *pEVar8;
        if (EVar3 == CubicTo) {
          pVVar5 = (this->m_points).super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
                   super__Vector_impl_data._M_start;
          VBezier::fromPoints(pVVar5 + lVar7 + -1,pVVar5 + lVar7,pVVar5 + lVar7 + 1,
                              pVVar5 + lVar7 + 2);
          fVar9 = VBezier::length(&VStack_48);
          fVar9 = fVar9 + this->mLength;
          this->mLength = fVar9;
          lVar7 = lVar7 + 3;
        }
        else {
          if (EVar3 == LineTo) {
            pVVar5 = (this->m_points).super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
                     super__Vector_impl_data._M_start;
            VVar1 = pVVar5[lVar7 + -1];
            VVar2 = pVVar5[lVar7];
            auVar13._0_4_ = VVar2.mx - VVar1.mx;
            auVar13._4_4_ = VVar2.my - VVar1.my;
            auVar13._8_8_ = 0;
            uVar6 = CONCAT44(auVar13._4_4_,auVar13._0_4_);
            auVar11._0_8_ = uVar6 ^ 0x8000000080000000;
            auVar11._8_4_ = 0x80000000;
            auVar11._12_4_ = 0x80000000;
            auVar11 = maxps(auVar11,auVar13);
            fVar10 = auVar11._0_4_;
            fVar12 = auVar11._4_4_;
            fVar9 = fVar9 + (float)(-(uint)(fVar12 < fVar10) & (uint)(fVar12 * 0.375 + fVar10) |
                                   ~-(uint)(fVar12 < fVar10) & (uint)(fVar10 * 0.375 + fVar12));
            this->mLength = fVar9;
          }
          else if (EVar3 != MoveTo) goto LAB_001133b1;
          lVar7 = lVar7 + 1;
        }
LAB_001133b1:
        pEVar8 = pEVar8 + 1;
      } while (pEVar8 != pEVar4);
    }
  }
  return fVar9;
}

Assistant:

float VPath::VPathData::length() const
{
    if (!mLengthDirty) return mLength;

    mLengthDirty = false;
    mLength = 0.0;

    size_t i = 0;
    for (auto e : m_elements) {
        switch (e) {
        case VPath::Element::MoveTo:
            i++;
            break;
        case VPath::Element::LineTo: {
            mLength += VLine(m_points[i - 1], m_points[i]).length();
            i++;
            break;
        }
        case VPath::Element::CubicTo: {
            mLength += VBezier::fromPoints(m_points[i - 1], m_points[i],
                                           m_points[i + 1], m_points[i + 2])
                           .length();
            i += 3;
            break;
        }
        case VPath::Element::Close:
            break;
        }
    }

    return mLength;
}